

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::ForVariableDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ForVariableDeclarationSyntax *this,size_t index)

{
  DeclaratorSyntax *pDVar1;
  Token local_20;
  
  if (index == 2) {
    pDVar1 = (this->declarator).ptr;
  }
  else {
    if (index != 1) {
      if (index == 0) {
        local_20.kind = (this->varKeyword).kind;
        local_20._2_1_ = (this->varKeyword).field_0x2;
        local_20.numFlags.raw = (this->varKeyword).numFlags.raw;
        local_20.rawLen = (this->varKeyword).rawLen;
        local_20.info._0_4_ = *(undefined4 *)&(this->varKeyword).info;
        local_20.info._4_4_ = *(undefined4 *)((long)&(this->varKeyword).info + 4);
      }
      else {
        parsing::Token::Token(&local_20);
      }
      *(undefined4 *)
       &(__return_storage_ptr__->super_ConstTokenOrSyntax).
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           local_20._0_4_;
      *(uint32_t *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4)
           = local_20.rawLen;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8)
           = local_20.info._0_4_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
       0xc) = local_20.info._4_4_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
       0x10) = '\0';
      return __return_storage_ptr__;
    }
    pDVar1 = (DeclaratorSyntax *)this->type;
  }
  *(DeclaratorSyntax **)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pDVar1;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ForVariableDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return varKeyword;
        case 1: return type;
        case 2: return declarator.get();
        default: return nullptr;
    }
}